

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls.cpp
# Opt level: O2

DtlsConfig * ot::commissioner::GetDtlsConfig(DtlsConfig *__return_storage_ptr__,Config *aConfig)

{
  __return_storage_ptr__->mLogLevel = 3;
  (__return_storage_ptr__->mPSK).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->mPSK).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->mPSK).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->mOwnKey).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->mOwnKey).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->mOwnKey).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->mOwnCert).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->mOwnCert).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->mOwnCert).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->mCaChain).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->mCaChain).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->mCaChain).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->mEnableDebugLogging = aConfig->mEnableDtlsDebugLogging;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&__return_storage_ptr__->mPSK,&aConfig->mPSKc);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&__return_storage_ptr__->mOwnKey,&aConfig->mPrivateKey);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&__return_storage_ptr__->mOwnCert,&aConfig->mCertificate);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&__return_storage_ptr__->mCaChain,&aConfig->mTrustAnchor);
  return __return_storage_ptr__;
}

Assistant:

DtlsConfig GetDtlsConfig(const Config &aConfig)
{
    DtlsConfig dtlsConfig;

    dtlsConfig.mEnableDebugLogging = aConfig.mEnableDtlsDebugLogging;

    dtlsConfig.mPSK     = aConfig.mPSKc;
    dtlsConfig.mOwnKey  = aConfig.mPrivateKey;
    dtlsConfig.mOwnCert = aConfig.mCertificate;
    dtlsConfig.mCaChain = aConfig.mTrustAnchor;

    return dtlsConfig;
}